

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 jx9CompileContinue(jx9_gen_state *pGen)

{
  sxu32 nLine;
  SyToken *pSVar1;
  SyToken *pSVar2;
  sxi32 sVar3;
  ulong uVar4;
  ulong uVar5;
  GenBlock *pBlock;
  GenBlock *pGVar6;
  sxu32 nInstrIdx;
  JumpFixup sJumpFix;
  sxu32 local_24 [3];
  
  pSVar1 = pGen->pIn;
  nLine = pSVar1->nLine;
  pSVar2 = pSVar1 + 1;
  pGen->pIn = pSVar2;
  uVar5 = 0;
  if ((pSVar2 < pGen->pEnd) && ((pSVar1[1].nType & 3) != 0)) {
    uVar4 = jx9TokenValueToInt64(&pSVar2->sData);
    uVar5 = 0;
    if (1 < (int)uVar4) {
      uVar5 = uVar4 & 0xffffffff;
    }
    pGen->pIn = pGen->pIn + 1;
  }
  pGVar6 = pGen->pCurrent;
  do {
    if ((pGVar6->iFlags & 1) != 0) {
      if ((int)uVar5 < 2) goto LAB_00127532;
      uVar5 = (ulong)((int)uVar5 - 1);
    }
    pGVar6 = pGVar6->pParent;
  } while ((pGVar6 != (GenBlock *)0x0) && ((pGVar6->iFlags & 10) == 0));
  pGVar6 = (GenBlock *)0x0;
LAB_00127532:
  if (pGVar6 == (GenBlock *)0x0) {
    sVar3 = jx9GenCompileError(pGen,1,nLine,
                               "A \'continue\' statement may only be used within a loop or switch");
    if (sVar3 == -10) {
      return -10;
    }
  }
  else {
    local_24[0] = 0;
    jx9VmEmitInstr(pGen->pVm,8,0,pGVar6->nFirstInstr,(void *)0x0,local_24);
    if (pGVar6->bPostContinue == '\x01') {
      local_24[1] = 8;
      local_24[2] = local_24[0];
      SySetPut(&pGVar6->aPostContFix,local_24 + 1);
    }
  }
  pSVar2 = pGen->pIn;
  if ((pSVar2 < pGen->pEnd) && ((pSVar2->nType & 0x40000) == 0)) {
    jx9GenCompileError(pGen,2,pSVar2->nLine,"Expected semi-colon \';\' after \'continue\' statement"
                      );
  }
  return 0;
}

Assistant:

static sxi32 jx9CompileContinue(jx9_gen_state *pGen)
{
	GenBlock *pLoop; /* Target loop */
	sxi32 iLevel;    /* How many nesting loop to skip */
	sxu32 nLine;
	sxi32 rc;
	nLine = pGen->pIn->nLine;
	iLevel = 0;
	/* Jump the 'continue' keyword */
	pGen->pIn++;
	if( pGen->pIn < pGen->pEnd && (pGen->pIn->nType & JX9_TK_NUM) ){
		/* optional numeric argument which tells us how many levels
		 * of enclosing loops we should skip to the end of. 
		 */
		iLevel = (sxi32)jx9TokenValueToInt64(&pGen->pIn->sData);
		if( iLevel < 2 ){
			iLevel = 0;
		}
		pGen->pIn++; /* Jump the optional numeric argument */
	}
	/* Point to the target loop */
	pLoop = GenStateFetchBlock(pGen->pCurrent, GEN_BLOCK_LOOP, iLevel);
	if( pLoop == 0 ){
		/* Illegal continue */
		rc = jx9GenCompileError(pGen, E_ERROR, nLine, "A 'continue' statement may only be used within a loop or switch");
		if( rc == SXERR_ABORT ){
			/* Error count limit reached, abort immediately */
			return SXERR_ABORT;
		}
	}else{
		sxu32 nInstrIdx = 0;
		/* Emit the unconditional jump to the beginning of the target loop */
		jx9VmEmitInstr(pGen->pVm, JX9_OP_JMP, 0, pLoop->nFirstInstr, 0, &nInstrIdx);
		if( pLoop->bPostContinue == TRUE ){
			JumpFixup sJumpFix;
			/* Post-continue */
			sJumpFix.nJumpType = JX9_OP_JMP;
			sJumpFix.nInstrIdx = nInstrIdx;
			SySetPut(&pLoop->aPostContFix, (const void *)&sJumpFix);
		}
	}
	if( pGen->pIn < pGen->pEnd && (pGen->pIn->nType & JX9_TK_SEMI) == 0 ){
		/* Not so fatal, emit a warning only */
		jx9GenCompileError(&(*pGen), E_WARNING, pGen->pIn->nLine, "Expected semi-colon ';' after 'continue' statement");
	}
	/* Statement successfully compiled */
	return SXRET_OK;
}